

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  bool bVar1;
  int iVar2;
  Meter *in_RCX;
  undefined4 in_EDX;
  Dictionary *in_RSI;
  undefined8 in_RDI;
  uint in_XMM0_Da;
  double __x;
  FastText *unaff_retaddr;
  Predictions predictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x185a66);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x185a70);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x185a7a);
  while (iVar2 = std::istream::peek(), iVar2 != -1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x185aa9);
    in_stack_ffffffffffffff70 = &local_50;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x185ab8);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x185ac6);
    Dictionary::getLine(in_RSI,(istream *)CONCAT44(in_EDX,in_XMM0_Da),
                        (vector<int,_std::allocator<int>_> *)in_RCX,in_stack_ffffffffffffffd8);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff70);
    if ((!bVar1) &&
       (bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff70), !bVar1)) {
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::clear
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x185b11)
      ;
      __x = (double)(ulong)in_XMM0_Da;
      predict(unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),
              (vector<int,_std::allocator<int>_> *)in_RSI,(Predictions *)CONCAT44(in_EDX,in_XMM0_Da)
              ,(real)((ulong)in_RCX >> 0x20));
      Meter::log(in_RCX,__x);
    }
  }
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             in_stack_ffffffffffffff70);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
    const {
  std::vector<int32_t> line;
  std::vector<int32_t> labels;
  Predictions predictions;

  while (in.peek() != EOF) {
    line.clear();
    labels.clear();
    dict_->getLine(in, line, labels);

    if (!labels.empty() && !line.empty()) {
      predictions.clear();
      predict(k, line, predictions, threshold);
      meter.log(labels, predictions);
    }
  }
}